

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

base_t * duckdb_je_base_new(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks,
                           _Bool metadata_use_hooks)

{
  _Bool _Var1;
  base_block_t *pbVar2;
  undefined1 in_CL;
  extent_hooks_t *in_RDX;
  undefined4 in_ESI;
  szind_t i;
  base_t *base;
  size_t base_size;
  size_t base_alignment;
  size_t gap_size;
  base_block_t *block;
  ehooks_t fake_ehooks;
  size_t duckdb_je_extent_sn_next;
  pszind_t pind_last;
  extent_hooks_t *in_stack_ffffffffffffff58;
  extent_hooks_t *extent_hooks_00;
  ehooks_t *in_stack_ffffffffffffff60;
  ehooks_t *ehooks;
  ehooks_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar3;
  ehooks_t *tsdn_00;
  base_t *alignment;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar4;
  size_t *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffc0;
  pszind_t *in_stack_ffffffffffffffc8;
  size_t sVar5;
  pszind_t pVar6;
  undefined3 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  base_t *local_8;
  
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  pVar6 = 0;
  sVar5 = 0;
  alignment = (base_t *)in_RDX;
  if ((char)(uVar4 >> 0x18) == '\0') {
    alignment = (base_t *)&duckdb_je_ehooks_default_extent_hooks;
  }
  duckdb_je_ehooks_init(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  extent_hooks_00 = (extent_hooks_t *)0xf68;
  ehooks = (ehooks_t *)0x10;
  pbVar2 = base_block_alloc((tsdn_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(base_t *)in_RDX,
                            (ehooks_t *)CONCAT44(uVar4,pVar6),(uint)(sVar5 >> 0x20),
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,base_alignment,
                            gap_size);
  if (pbVar2 == (base_block_t *)0x0) {
    local_8 = (base_t *)0x0;
  }
  else {
    local_8 = (base_t *)
              base_extent_bump_alloc_helper
                        ((edata_t *)0xf80,in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (size_t)alignment);
    duckdb_je_ehooks_init(ehooks,extent_hooks_00,0);
    tsdn_00 = &local_8->ehooks_base;
    if ((uVar4 & 0x1000000) == 0) {
      in_RDX = &duckdb_je_ehooks_default_extent_hooks;
    }
    duckdb_je_ehooks_init(ehooks,extent_hooks_00,0);
    _Var1 = duckdb_je_malloc_mutex_init
                      ((malloc_mutex_t *)in_stack_ffffffffffffff68,(char *)ehooks,
                       (witness_rank_t)((ulong)extent_hooks_00 >> 0x20),
                       (malloc_mutex_lock_order_t)extent_hooks_00);
    if (_Var1) {
      base_unmap((tsdn_t *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,(uint)((ulong)ehooks >> 0x20),extent_hooks_00,0x24c7cae);
      local_8 = (base_t *)0x0;
    }
    else {
      local_8->pind_last = pVar6;
      local_8->duckdb_je_extent_sn_next = sVar5;
      local_8->blocks = pbVar2;
      local_8->auto_thp_switched = false;
      for (uVar4 = 0; uVar4 < 0xe8; uVar4 = uVar4 + 1) {
        duckdb_je_edata_heap_new(local_8->avail + uVar4);
      }
      duckdb_je_edata_avail_new(&local_8->edata_avail);
      local_8->edata_allocated = 0;
      local_8->rtree_allocated = 0;
      local_8->allocated = 0x90;
      local_8->resident = 0x1000;
      local_8->mapped = pbVar2->size;
      uVar3 = false;
      if (duckdb_je_opt_metadata_thp == metadata_thp_always) {
        uVar3 = metadata_thp_madvise();
      }
      local_8->n_thp = (ulong)((_Bool)uVar3 != false);
      malloc_mutex_lock((tsdn_t *)in_RDX,(malloc_mutex_t *)CONCAT17(uVar3,in_stack_ffffffffffffff70)
                       );
      base_extent_bump_alloc_post
                ((tsdn_t *)tsdn_00,(base_t *)in_RDX,
                 (edata_t *)CONCAT17(uVar3,in_stack_ffffffffffffff70),
                 (size_t)in_stack_ffffffffffffff68,ehooks,(size_t)extent_hooks_00);
      malloc_mutex_unlock((tsdn_t *)CONCAT17(uVar3,in_stack_ffffffffffffff70),
                          (malloc_mutex_t *)in_stack_ffffffffffffff68);
    }
  }
  return local_8;
}

Assistant:

base_t *
base_new(tsdn_t *tsdn, unsigned ind, const extent_hooks_t *extent_hooks,
    bool metadata_use_hooks) {
	pszind_t pind_last = 0;
	size_t extent_sn_next = 0;

	/*
	 * The base will contain the ehooks eventually, but it itself is
	 * allocated using them.  So we use some stack ehooks to bootstrap its
	 * memory, and then initialize the ehooks within the base_t.
	 */
	ehooks_t fake_ehooks;
	ehooks_init(&fake_ehooks, metadata_use_hooks ?
	    (extent_hooks_t *)extent_hooks :
	    (extent_hooks_t *)&ehooks_default_extent_hooks, ind);

	base_block_t *block = base_block_alloc(tsdn, NULL, &fake_ehooks, ind,
	    &pind_last, &extent_sn_next, sizeof(base_t), QUANTUM);
	if (block == NULL) {
		return NULL;
	}

	size_t gap_size;
	size_t base_alignment = CACHELINE;
	size_t base_size = ALIGNMENT_CEILING(sizeof(base_t), base_alignment);
	base_t *base = (base_t *)base_extent_bump_alloc_helper(&block->edata,
	    &gap_size, base_size, base_alignment);
	ehooks_init(&base->ehooks, (extent_hooks_t *)extent_hooks, ind);
	ehooks_init(&base->ehooks_base, metadata_use_hooks ?
	    (extent_hooks_t *)extent_hooks :
	    (extent_hooks_t *)&ehooks_default_extent_hooks, ind);
	if (malloc_mutex_init(&base->mtx, "base", WITNESS_RANK_BASE,
	    malloc_mutex_rank_exclusive)) {
		base_unmap(tsdn, &fake_ehooks, ind, block, block->size);
		return NULL;
	}
	base->pind_last = pind_last;
	base->extent_sn_next = extent_sn_next;
	base->blocks = block;
	base->auto_thp_switched = false;
	for (szind_t i = 0; i < SC_NSIZES; i++) {
		edata_heap_new(&base->avail[i]);
	}
	edata_avail_new(&base->edata_avail);

	if (config_stats) {
		base->edata_allocated = 0;
		base->rtree_allocated = 0;
		base->allocated = sizeof(base_block_t);
		base->resident = PAGE_CEILING(sizeof(base_block_t));
		base->mapped = block->size;
		base->n_thp = (opt_metadata_thp == metadata_thp_always) &&
		    metadata_thp_madvise() ? HUGEPAGE_CEILING(sizeof(base_block_t))
		    >> LG_HUGEPAGE : 0;
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		assert(base->n_thp << LG_HUGEPAGE <= base->mapped);
	}

	/* Locking here is only necessary because of assertions. */
	malloc_mutex_lock(tsdn, &base->mtx);
	base_extent_bump_alloc_post(tsdn, base, &block->edata, gap_size, base,
	    base_size);
	malloc_mutex_unlock(tsdn, &base->mtx);

	return base;
}